

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O0

PtrTokenOrSyntax * __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::getChildPtr
          (SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *this,size_t index)

{
  bool bVar1;
  PtrTokenOrSyntax *in_RSI;
  SyntaxNode *in_RDI;
  PtrTokenOrSyntax *local_10;
  
  std::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::operator[]
            ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)&in_RDI[1].previewNode,
             (size_type)in_RSI);
  bVar1 = ConstTokenOrSyntax::isNode((ConstTokenOrSyntax *)0x286a9d);
  if (bVar1) {
    std::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::operator[]
              ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)&in_RDI[1].previewNode,
               (size_type)in_RSI);
    TokenOrSyntax::node((TokenOrSyntax *)0x286abd);
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RSI,in_RDI);
  }
  else {
    std::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::operator[]
              ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)&in_RDI[1].previewNode,
               (size_type)in_RSI);
    std::get<slang::parsing::Token,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
              ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)0x286ae6);
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RSI,(Token *)in_RDI);
  }
  return local_10;
}

Assistant:

PtrTokenOrSyntax getChildPtr(size_t index) final {
        if (elements[index].isNode())
            return elements[index].node();
        else
            return &(std::get<parsing::Token>(elements[index]));
    }